

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O2

void dis_pp_expr(decoctx *deco,dis_res *dres,easm_expr *expr,uint64_t pos)

{
  uint uVar1;
  easm_expr *peVar2;
  ulong uVar3;
  int iVar4;
  easm_expr_type eVar5;
  uint32_t uVar6;
  uint uVar7;
  char *pcVar8;
  easm_expr *peVar9;
  long lVar10;
  byte *pbVar11;
  
  if (expr->e1 != (easm_expr *)0x0) {
    dis_pp_expr(deco,dres,expr->e1,pos);
  }
  if (expr->e2 != (easm_expr *)0x0) {
    dis_pp_expr(deco,dres,expr->e2,pos);
  }
  if (expr->sinsn != (easm_sinsn *)0x0) {
    dis_pp_sinsn(deco,dres,expr->sinsn,pos);
  }
  easm_substpos_expr(expr,pos);
  iVar4 = easm_cfold_expr(expr);
  if (iVar4 != 0) {
    if (expr->special == EASM_SPEC_BTARG) {
      mark(deco,(uint32_t)expr->num,1);
      pcVar8 = deco_label(deco,expr->num);
      expr->alabel = pcVar8;
    }
    else if (expr->special == EASM_SPEC_CTARG) {
      mark(deco,(uint32_t)expr->num,2);
      pcVar8 = deco_label(deco,expr->num);
      expr->alabel = pcVar8;
      uVar7 = (uint)expr->num;
      uVar1 = deco->codebase;
      if (((uVar1 <= uVar7) && (uVar7 < uVar1 + deco->codesz)) &&
         ((*(byte *)(deco->marks + (uVar7 - uVar1)) & 0x40) != 0)) {
        dres->endmark = 1;
      }
    }
    if (((long)expr->num < 0) && (expr->special == EASM_SPEC_NONE)) {
      expr->type = EASM_EXPR_NEG;
      peVar9 = easm_expr_num(EASM_EXPR_NUM,-expr->num);
      expr->e1 = peVar9;
      expr->num = 0;
    }
  }
  eVar5 = expr->type;
  if (eVar5 == EASM_EXPR_ADD) {
    peVar9 = expr->e1;
    eVar5 = EASM_EXPR_ADD;
    if ((peVar9->type == EASM_EXPR_NUM) && (peVar9->num == 0)) {
      peVar2 = expr->e2;
      free(peVar9);
      memcpy(expr,peVar2,0x88);
      free(peVar2);
      eVar5 = expr->type;
      goto LAB_00247c87;
    }
  }
  else {
LAB_00247c87:
    if ((eVar5 & ~EASM_EXPR_LOR) != EASM_EXPR_ADD) goto LAB_00247cea;
  }
  peVar9 = expr->e2;
  if ((peVar9->type == EASM_EXPR_NUM) && (peVar9->num == 0)) {
    peVar2 = expr->e1;
    free(peVar9);
    memcpy(expr,peVar2,0x88);
    free(peVar2);
    eVar5 = expr->type;
  }
  if (eVar5 == EASM_EXPR_ADD) {
    peVar9 = expr->e2;
    if (peVar9->type != EASM_EXPR_NUM) {
      return;
    }
    if (-1 < (long)peVar9->num) {
      return;
    }
    peVar9->num = -peVar9->num;
    expr->type = EASM_EXPR_SUB;
    return;
  }
LAB_00247cea:
  if ((eVar5 == EASM_EXPR_MEM) && (expr->special == EASM_SPEC_LITERAL)) {
    if (expr->e1->type == EASM_EXPR_NUM) {
      uVar3 = expr->e1->num;
      mark(deco,(uint32_t)uVar3,0x10);
      if ((deco->codebase <= uVar3) && (uVar3 <= deco->codebase + deco->codesz)) {
        uVar6 = ed_getcbsz(deco->isa,deco->varinfo);
        if (uVar6 == 8) {
          pbVar11 = deco->code + (uVar3 - deco->codebase);
          uVar7 = 0;
          for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 8) {
            uVar7 = uVar7 | (uint)*pbVar11 << ((byte)lVar10 & 0x1f);
            pbVar11 = pbVar11 + 1;
          }
          expr->alit = (ulong)uVar7;
          return;
        }
        abort();
      }
    }
    expr->special = EASM_SPEC_NONE;
  }
  return;
}

Assistant:

static void dis_pp_expr(struct decoctx *deco, struct dis_res *dres, struct easm_expr *expr, uint64_t pos) {
	if (expr->e1)
		dis_pp_expr(deco, dres, expr->e1, pos);
	if (expr->e2)
		dis_pp_expr(deco, dres, expr->e2, pos);
	if (expr->sinsn)
		dis_pp_sinsn(deco, dres, expr->sinsn, pos);
	easm_substpos_expr(expr, pos);
	if (easm_cfold_expr(expr)) {
		if (expr->special == EASM_SPEC_CTARG) {
			mark(deco, expr->num, 2);
			expr->alabel = deco_label(deco, expr->num);
			if (is_nr_mark(deco, expr->num))
				dres->endmark = 1;
		} else if (expr->special == EASM_SPEC_BTARG) {
			mark(deco, expr->num, 1);
			expr->alabel = deco_label(deco, expr->num);
		}
		if (expr->num & 1ull << 63 && !expr->special) {
			expr->type = EASM_EXPR_NEG;
			expr->e1 = easm_expr_num(EASM_EXPR_NUM, -expr->num);
			expr->num = 0;
		}
	}
	if (expr->type == EASM_EXPR_ADD && expr->e1->type == EASM_EXPR_NUM && expr->e1->num == 0) {
		struct easm_expr *oe2 = expr->e2;
		free(expr->e1);
		*expr = *oe2;
		free(oe2);
	}
	if ((expr->type == EASM_EXPR_ADD || expr->type == EASM_EXPR_SUB) && expr->e2->type == EASM_EXPR_NUM && expr->e2->num == 0) {
		struct easm_expr *oe1 = expr->e1;
		free(expr->e2);
		*expr = *oe1;
		free(oe1);
	}
	if (expr->type == EASM_EXPR_ADD && expr->e2->type == EASM_EXPR_NUM && expr->e2->num & 1ull << 63) {
		expr->e2->num = -expr->e2->num;
		expr->type = EASM_EXPR_SUB;
	}
	if (expr->type == EASM_EXPR_MEM && expr->special == EASM_SPEC_LITERAL) {
		if (expr->e1->type != EASM_EXPR_NUM) {
			expr->special = EASM_SPEC_NONE;
		} else {
			ull ptr = expr->e1->num;
			mark(deco, ptr, 0x10);
			if (ptr < deco->codebase || ptr > deco->codebase + deco->codesz) {
				expr->special = EASM_SPEC_NONE;
			} else {
				if (ed_getcbsz(deco->isa, deco->varinfo) != 8)
					abort();
				uint32_t num = 0;
				int j;
				for (j = 0; j < 4; j++)
					num |= deco->code[ptr - deco->codebase + j] << j*8;
				expr->alit = num;
			}
		}
	}
}